

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O1

uint8_t convert_stage2_attrs(CPUARMState_conflict *env,uint8_t s2attrs)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  
  bVar4 = s2attrs & 3;
  bVar1 = 0;
  bVar2 = s2attrs >> 2 & 3;
  if ((s2attrs & 0xc) == 0) {
    bVar5 = 0;
    bVar6 = bVar4;
    bVar3 = bVar2;
  }
  else {
    bVar5 = 0;
    bVar1 = 0;
    bVar6 = 1;
    bVar3 = 1;
    if (((env->cp15).hcr_el2 & 0x100000000) == 0) {
      bVar5 = (bVar4 != 1) * '\x03';
      bVar1 = 0x30;
      bVar6 = bVar4;
      bVar3 = bVar2;
      if (bVar2 == 1) {
        bVar1 = 0;
      }
    }
  }
  return (bVar3 << 6 | bVar1) + bVar6 * '\x04' | bVar5;
}

Assistant:

static inline uint32_t extract32(uint32_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 32 - start);
    return (value >> start) & (~0U >> (32 - length));
}